

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::DrawInstancedGeometryInstancedCase::genVertexAttribData
          (DrawInstancedGeometryInstancedCase *this)

{
  reference pvVar1;
  Vector<float,_4> local_a0;
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_4> local_30;
  Vector<float,_4> local_20;
  DrawInstancedGeometryInstancedCase *local_10;
  DrawInstancedGeometryInstancedCase *this_local;
  
  (this->super_GeometryShaderRenderTest).m_numDrawVertices = 1;
  (this->super_GeometryShaderRenderTest).m_numDrawInstances = this->m_numInstances;
  (this->super_GeometryShaderRenderTest).m_vertexAttrDivisor = 1;
  local_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexPosData,1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,8);
  tcu::Vector<float,_4>::Vector(&local_20,0.0,0.0,0.0,1.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexPosData,0);
  *(undefined8 *)pvVar1->m_data = local_20.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_20.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_30,0.5,0.0,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,0);
  *(undefined8 *)pvVar1->m_data = local_30.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_30.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_40,0.0,0.5,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,1);
  *(undefined8 *)pvVar1->m_data = local_40.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_40.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_50,-0.7,-0.1,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,2);
  *(undefined8 *)pvVar1->m_data = local_50.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_50.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_60,-0.1,-0.7,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,3);
  *(undefined8 *)pvVar1->m_data = local_60.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_60.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_70,-0.8,-0.7,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,4);
  *(undefined8 *)pvVar1->m_data = local_70.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_70.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_80,-0.9,0.6,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,5);
  *(undefined8 *)pvVar1->m_data = local_80.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_80.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_90,-0.8,0.3,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,6);
  *(undefined8 *)pvVar1->m_data = local_90.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_90.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_a0,-0.1,0.1,0.0,0.0);
  pvVar1 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     (&(this->super_GeometryShaderRenderTest).m_vertexAttrData,7);
  *(undefined8 *)pvVar1->m_data = local_a0.m_data._0_8_;
  *(undefined8 *)(pvVar1->m_data + 2) = local_a0.m_data._8_8_;
  return;
}

Assistant:

void DrawInstancedGeometryInstancedCase::genVertexAttribData (void)
{
	m_numDrawVertices = 1;
	m_numDrawInstances = m_numInstances;
	m_vertexAttrDivisor = 1;

	m_vertexPosData.resize(1);
	m_vertexAttrData.resize(8);

	m_vertexPosData[0] = tcu::Vec4( 0.0f,  0.0f, 0.0f, 1.0f);

	m_vertexAttrData[0] = tcu::Vec4( 0.5f,  0.0f, 0.0f, 0.0f);
	m_vertexAttrData[1] = tcu::Vec4( 0.0f,  0.5f, 0.0f, 0.0f);
	m_vertexAttrData[2] = tcu::Vec4(-0.7f, -0.1f, 0.0f, 0.0f);
	m_vertexAttrData[3] = tcu::Vec4(-0.1f, -0.7f, 0.0f, 0.0f);
	m_vertexAttrData[4] = tcu::Vec4(-0.8f, -0.7f, 0.0f, 0.0f);
	m_vertexAttrData[5] = tcu::Vec4(-0.9f,  0.6f, 0.0f, 0.0f);
	m_vertexAttrData[6] = tcu::Vec4(-0.8f,  0.3f, 0.0f, 0.0f);
	m_vertexAttrData[7] = tcu::Vec4(-0.1f,  0.1f, 0.0f, 0.0f);

	DE_ASSERT(m_numInstances <= (int)m_vertexAttrData.size());
}